

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  IStreamingReporter *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  int iVar5;
  SectionTracker *pSVar6;
  NameAndLocation local_60;
  
  std::__cxx11::string::string((string *)&local_60,&sectionInfo->name);
  local_60.location.file = (sectionInfo->lineInfo).file;
  local_60.location.line = (sectionInfo->lineInfo).line;
  pSVar6 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  iVar5 = (*(pSVar6->super_TrackerBase).super_ITracker._vptr_ITracker[4])(pSVar6);
  if (SUB41(iVar5,0) != false) {
    local_60.name._M_dataplus._M_p = (pointer)pSVar6;
    std::
    vector<Catch::TestCaseTracking::ITracker*,std::allocator<Catch::TestCaseTracking::ITracker*>>::
    emplace_back<Catch::TestCaseTracking::ITracker*>
              ((vector<Catch::TestCaseTracking::ITracker*,std::allocator<Catch::TestCaseTracking::ITracker*>>
                *)&this->m_activeSections,(ITracker **)&local_60);
    uVar2 = *(undefined4 *)((long)&(sectionInfo->lineInfo).file + 4);
    sVar4 = (sectionInfo->lineInfo).line;
    uVar3 = *(undefined4 *)((long)&(sectionInfo->lineInfo).line + 4);
    *(undefined4 *)&(this->m_lastAssertionInfo).lineInfo.file =
         *(undefined4 *)&(sectionInfo->lineInfo).file;
    *(undefined4 *)((long)&(this->m_lastAssertionInfo).lineInfo.file + 4) = uVar2;
    *(int *)&(this->m_lastAssertionInfo).lineInfo.line = (int)sVar4;
    *(undefined4 *)((long)&(this->m_lastAssertionInfo).lineInfo.line + 4) = uVar3;
    pIVar1 = (this->m_reporter)._M_t.
             super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
    (*pIVar1->_vptr_IStreamingReporter[8])(pIVar1,sectionInfo);
    assertions->failedButOk = (this->m_totals).assertions.failedButOk;
    sVar4 = (this->m_totals).assertions.failed;
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = sVar4;
  }
  return SUB41(iVar5,0);
}

Assistant:

bool RunContext::sectionStarted(SectionInfo const & sectionInfo, Counts & assertions) {
        ITracker& sectionTracker = SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(sectionInfo.name, sectionInfo.lineInfo));
        if (!sectionTracker.isOpen())
            return false;
        m_activeSections.push_back(&sectionTracker);

        m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

        m_reporter->sectionStarting(sectionInfo);

        assertions = m_totals.assertions;

        return true;
    }